

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TileWire.cpp
# Opt level: O2

void __thiscall
TileWire::_checkForInvalidState
          (TileWire *this,State targetState,State *state,FollowWireStage *stage)

{
  if (*stage == INITIAL_STAGE) {
    if (targetState != MIDDLE) {
      *stage = INPUT_FOUND;
    }
    if (*state != targetState) {
      *state = targetState;
      _fixTraversedWires(this,targetState);
      return;
    }
  }
  else if ((targetState != MIDDLE) && (*state != targetState)) {
    *stage = INVALID_STAGE;
    return;
  }
  return;
}

Assistant:

void TileWire::_checkForInvalidState(State targetState, State& state, FollowWireStage& stage) const {
    if (stage == INITIAL_STAGE) {
        if (targetState != MIDDLE) {
            stage = INPUT_FOUND;
        }
        if (state != targetState) {
            state = targetState;
            _fixTraversedWires(state);
        }
    } else if (targetState != MIDDLE && state != targetState) {
        stage = INVALID_STAGE;
    }
}